

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O0

void __thiscall
backward::SignalHandling::SignalHandling
          (SignalHandling *this,vector<int,_std::allocator<int>_> *posix_signals)

{
  ulong uVar1;
  int iVar2;
  dummy *pdVar3;
  size_type sVar4;
  const_reference pvVar5;
  vector<int,_std::allocator<int>_> *in_RSI;
  handle<char_*,_backward::details::deleter<void,_void_*,_&free>_> *in_RDI;
  int r;
  sigaction action;
  size_t i;
  stack_t ss;
  size_t stack_size;
  bool success;
  handle<char_*,_backward::details::deleter<void,_void_*,_&free>_> *new_val;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  sigaction local_e8;
  ulong local_50;
  sigaltstack local_48;
  undefined8 local_20;
  byte local_11;
  vector<int,_std::allocator<int>_> *local_10;
  
  new_val = in_RDI;
  local_10 = in_RSI;
  details::handle<char_*,_backward::details::deleter<void,_void_*,_&free>_>::handle(in_RDI);
  *(undefined1 *)&new_val[1]._val = 0;
  local_11 = 1;
  local_20 = 0x800000;
  malloc(0x800000);
  details::handle<char_*,_backward::details::deleter<void,_void_*,_&free>_>::reset
            ((handle<char_*,_backward::details::deleter<void,_void_*,_&free>_> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),(char *)new_val);
  pdVar3 = details::handle::operator_cast_to_dummy_((handle *)in_RDI);
  if (pdVar3 == (dummy *)0x0) {
    local_11 = 0;
  }
  else {
    local_48.ss_sp =
         details::handle<char_*,_backward::details::deleter<void,_void_*,_&free>_>::get(in_RDI);
    local_48.ss_size = 0x800000;
    local_48.ss_flags = 0;
    iVar2 = sigaltstack(&local_48,(sigaltstack *)0x0);
    if (iVar2 < 0) {
      local_11 = 0;
    }
  }
  for (local_50 = 0; uVar1 = local_50,
      sVar4 = std::vector<int,_std::allocator<int>_>::size(local_10), uVar1 < sVar4;
      local_50 = local_50 + 1) {
    memset(&local_e8,0,0x98);
    local_e8.sa_flags = -0x37fffffc;
    sigfillset(&local_e8.sa_mask);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_10,local_50);
    sigdelset(&local_e8.sa_mask,*pvVar5);
    local_e8.__sigaction_handler.sa_handler = sig_handler;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_10,local_50);
    iVar2 = sigaction(*pvVar5,&local_e8,(sigaction *)0x0);
    if (iVar2 < 0) {
      local_11 = 0;
    }
  }
  *(byte *)&in_RDI[1]._val = local_11 & 1;
  return;
}

Assistant:

SignalHandling(const std::vector<int> &posix_signals = make_default_signals())
      : _loaded(false) {
    bool success = true;

    const size_t stack_size = 1024 * 1024 * 8;
    _stack_content.reset(static_cast<char *>(malloc(stack_size)));
    if (_stack_content) {
      stack_t ss;
      ss.ss_sp = _stack_content.get();
      ss.ss_size = stack_size;
      ss.ss_flags = 0;
      if (sigaltstack(&ss, nullptr) < 0) {
        success = false;
      }
    } else {
      success = false;
    }

    for (size_t i = 0; i < posix_signals.size(); ++i) {
      struct sigaction action;
      memset(&action, 0, sizeof action);
      action.sa_flags =
          static_cast<int>(SA_SIGINFO | SA_ONSTACK | SA_NODEFER | SA_RESETHAND);
      sigfillset(&action.sa_mask);
      sigdelset(&action.sa_mask, posix_signals[i]);
#if defined(__clang__)
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wdisabled-macro-expansion"
#endif
      action.sa_sigaction = &sig_handler;
#if defined(__clang__)
#pragma clang diagnostic pop
#endif

      int r = sigaction(posix_signals[i], &action, nullptr);
      if (r < 0)
        success = false;
    }

    _loaded = success;
  }